

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O2

TestCaseGroup * vkt::pipeline::createCacheTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  TestNode *pTVar2;
  CacheTest *this;
  TestNode *node;
  long lVar3;
  CacheTestParam *pCVar4;
  allocator<char> local_15a;
  allocator<char> local_159;
  TestContext *local_158;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> graphicsTests;
  VkShaderStageFlagBits testParamShaders0 [2];
  string local_138;
  string local_118;
  VkShaderStageFlagBits testParamShaders [2];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> miscTests;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> cacheTests;
  CacheTestParam testParams [3];
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  local_158 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"cache","pipeline cache tests");
  cacheTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = pTVar1;
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,local_158,"graphics_tests","Test pipeline cache with graphics pipeline.");
  testParamShaders0[0] = VK_SHADER_STAGE_VERTEX_BIT;
  testParamShaders0[1] = VK_SHADER_STAGE_FRAGMENT_BIT;
  graphicsTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = pTVar1;
  anon_unknown_0::CacheTestParam::CacheTestParam(testParams,testParamShaders0,2);
  anon_unknown_0::CacheTestParam::CacheTestParam
            (testParams + 1,(VkShaderStageFlagBits *)&DAT_009523d4,3);
  anon_unknown_0::CacheTestParam::CacheTestParam
            (testParams + 2,(VkShaderStageFlagBits *)&DAT_00952770,4);
  for (lVar3 = 0;
      pTVar1 = graphicsTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, lVar3 != 0x78; lVar3 = lVar3 + 0x28) {
    pTVar2 = (TestNode *)operator_new(0x98);
    pCVar4 = (CacheTestParam *)((long)testParams[0].m_shaders + lVar3 + -8);
    (*pCVar4->_vptr_CacheTestParam[2])(&local_138,pCVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,local_138._M_dataplus._M_p,&local_159);
    (*pCVar4->_vptr_CacheTestParam[3])(testParamShaders,pCVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&miscTests,(char *)testParamShaders,&local_15a);
    anon_unknown_0::GraphicsCacheTest::GraphicsCacheTest
              ((GraphicsCacheTest *)pTVar2,local_158,&local_118,(string *)&miscTests,pCVar4);
    std::__cxx11::string::~string((string *)&miscTests);
    std::__cxx11::string::~string((string *)testParamShaders);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  }
  graphicsTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(cacheTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar1->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&graphicsTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,local_158,"pipeline_from_get_data","Test pipeline cache with graphics pipeline."
            );
  testParamShaders0[0] = VK_SHADER_STAGE_VERTEX_BIT;
  testParamShaders0[1] = VK_SHADER_STAGE_FRAGMENT_BIT;
  graphicsTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = pTVar1;
  anon_unknown_0::CacheTestParam::CacheTestParam(testParams,testParamShaders0,2);
  anon_unknown_0::CacheTestParam::CacheTestParam
            (testParams + 1,(VkShaderStageFlagBits *)&DAT_009523d4,3);
  anon_unknown_0::CacheTestParam::CacheTestParam
            (testParams + 2,(VkShaderStageFlagBits *)&DAT_00952770,4);
  for (lVar3 = 0;
      pTVar1 = graphicsTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, lVar3 != 0x78; lVar3 = lVar3 + 0x28) {
    pTVar2 = (TestNode *)operator_new(0x98);
    pCVar4 = (CacheTestParam *)((long)testParams[0].m_shaders + lVar3 + -8);
    (*pCVar4->_vptr_CacheTestParam[2])(&local_138,pCVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,local_138._M_dataplus._M_p,&local_159);
    (*pCVar4->_vptr_CacheTestParam[3])(testParamShaders,pCVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&miscTests,(char *)testParamShaders,&local_15a);
    anon_unknown_0::GraphicsCacheTest::GraphicsCacheTest
              ((GraphicsCacheTest *)pTVar2,local_158,&local_118,(string *)&miscTests,pCVar4);
    pTVar2->_vptr_TestNode = (_func_int **)&PTR__CacheTest_00bccd30;
    std::__cxx11::string::~string((string *)&miscTests);
    std::__cxx11::string::~string((string *)testParamShaders);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  }
  graphicsTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(cacheTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar1->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&graphicsTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,local_158,"pipeline_from_incomplete_get_data",
             "Test pipeline cache with graphics pipeline.");
  testParamShaders0[0] = VK_SHADER_STAGE_VERTEX_BIT;
  testParamShaders0[1] = VK_SHADER_STAGE_FRAGMENT_BIT;
  graphicsTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = pTVar1;
  anon_unknown_0::CacheTestParam::CacheTestParam(testParams,testParamShaders0,2);
  anon_unknown_0::CacheTestParam::CacheTestParam
            (testParams + 1,(VkShaderStageFlagBits *)&DAT_009523d4,3);
  anon_unknown_0::CacheTestParam::CacheTestParam
            (testParams + 2,(VkShaderStageFlagBits *)&DAT_00952770,4);
  for (lVar3 = 0;
      pTVar1 = graphicsTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, lVar3 != 0x78; lVar3 = lVar3 + 0x28) {
    pTVar2 = (TestNode *)operator_new(0x98);
    pCVar4 = (CacheTestParam *)((long)testParams[0].m_shaders + lVar3 + -8);
    (*pCVar4->_vptr_CacheTestParam[2])(&local_138,pCVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,local_138._M_dataplus._M_p,&local_159);
    (*pCVar4->_vptr_CacheTestParam[3])(testParamShaders,pCVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&miscTests,(char *)testParamShaders,&local_15a);
    anon_unknown_0::GraphicsCacheTest::GraphicsCacheTest
              ((GraphicsCacheTest *)pTVar2,local_158,&local_118,(string *)&miscTests,pCVar4);
    pTVar2->_vptr_TestNode = (_func_int **)&PTR__CacheTest_00bccde0;
    std::__cxx11::string::~string((string *)&miscTests);
    std::__cxx11::string::~string((string *)testParamShaders);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  }
  graphicsTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(cacheTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar1->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&graphicsTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,local_158,"compute_tests",
             "Test pipeline cache with compute pipeline.");
  testParamShaders0[0] = VK_SHADER_STAGE_COMPUTE_BIT;
  graphicsTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = (TestCaseGroup *)pTVar2;
  anon_unknown_0::CacheTestParam::CacheTestParam(testParams,testParamShaders0,1);
  this = (CacheTest *)operator_new(0x98);
  (*testParams[0]._vptr_CacheTestParam[2])(&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,local_138._M_dataplus._M_p,&local_159);
  (*testParams[0]._vptr_CacheTestParam[3])(testParamShaders);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&miscTests,(char *)testParamShaders,&local_15a);
  anon_unknown_0::CacheTest::CacheTest(this,local_158,&local_118,(string *)&miscTests,testParams);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__CacheTest_00bcce90;
  std::__cxx11::string::~string((string *)&miscTests);
  std::__cxx11::string::~string((string *)testParamShaders);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  tcu::TestNode::addChild(pTVar2,(TestNode *)this);
  pTVar1 = graphicsTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  graphicsTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(cacheTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar1->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&graphicsTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,local_158,"misc_tests",
             "Misc tests that can not be categorized to other group.");
  testParamShaders[0] = VK_SHADER_STAGE_VERTEX_BIT;
  testParamShaders[1] = VK_SHADER_STAGE_FRAGMENT_BIT;
  miscTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = (TestCaseGroup *)pTVar2;
  anon_unknown_0::CacheTestParam::CacheTestParam(testParams,testParamShaders,2);
  node = (TestNode *)operator_new(0x98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"merge_cache_test",(allocator<char> *)&graphicsTests);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"Merge the caches test.",(allocator<char> *)testParamShaders0);
  anon_unknown_0::GraphicsCacheTest::GraphicsCacheTest
            ((GraphicsCacheTest *)node,local_158,&local_118,&local_138,testParams);
  node->_vptr_TestNode = (_func_int **)&PTR__CacheTest_00bcc9c0;
  tcu::TestNode::addChild(pTVar2,node);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  pTVar1 = miscTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  pTVar2 = (TestNode *)operator_new(0x98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"cache_header_test",(allocator<char> *)&graphicsTests);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"Cache header test.",(allocator<char> *)testParamShaders0);
  anon_unknown_0::GraphicsCacheTest::GraphicsCacheTest
            ((GraphicsCacheTest *)pTVar2,local_158,&local_118,&local_138,testParams);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__CacheTest_00bccbd0;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  pTVar1 = miscTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  pTVar2 = (TestNode *)operator_new(0x98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"invalid_size_test",(allocator<char> *)&graphicsTests);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"Invalid size test.",(allocator<char> *)testParamShaders0);
  anon_unknown_0::GraphicsCacheTest::GraphicsCacheTest
            ((GraphicsCacheTest *)pTVar2,local_158,&local_118,&local_138,testParams);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__CacheTest_00bccc80;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  pTVar1 = miscTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  miscTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(cacheTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar1->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&miscTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  pTVar1 = cacheTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  cacheTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&cacheTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createCacheTests (tcu::TestContext& testCtx)
{

	de::MovePtr<tcu::TestCaseGroup> cacheTests (new tcu::TestCaseGroup(testCtx, "cache", "pipeline cache tests"));

	// Graphics Pipeline Tests
	{
		de::MovePtr<tcu::TestCaseGroup> graphicsTests (new tcu::TestCaseGroup(testCtx, "graphics_tests", "Test pipeline cache with graphics pipeline."));

		const VkShaderStageFlagBits testParamShaders0[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const VkShaderStageFlagBits testParamShaders1[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_GEOMETRY_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const VkShaderStageFlagBits testParamShaders2[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
			VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const CacheTestParam testParams[] =
		{
			CacheTestParam(testParamShaders0, DE_LENGTH_OF_ARRAY(testParamShaders0)),
			CacheTestParam(testParamShaders1, DE_LENGTH_OF_ARRAY(testParamShaders1)),
			CacheTestParam(testParamShaders2, DE_LENGTH_OF_ARRAY(testParamShaders2)),
		};

		for (deUint32 i = 0; i < DE_LENGTH_OF_ARRAY(testParams); i++)
			graphicsTests->addChild(newTestCase<GraphicsCacheTest>(testCtx, &testParams[i]));

		cacheTests->addChild(graphicsTests.release());
	}

	// Graphics Pipeline Tests
	{
		de::MovePtr<tcu::TestCaseGroup> graphicsTests(new tcu::TestCaseGroup(testCtx, "pipeline_from_get_data", "Test pipeline cache with graphics pipeline."));

		const VkShaderStageFlagBits testParamShaders0[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const VkShaderStageFlagBits testParamShaders1[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_GEOMETRY_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const VkShaderStageFlagBits testParamShaders2[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
			VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const CacheTestParam testParams[] =
		{
			CacheTestParam(testParamShaders0, DE_LENGTH_OF_ARRAY(testParamShaders0)),
			CacheTestParam(testParamShaders1, DE_LENGTH_OF_ARRAY(testParamShaders1)),
			CacheTestParam(testParamShaders2, DE_LENGTH_OF_ARRAY(testParamShaders2)),
		};

		for (deUint32 i = 0; i < DE_LENGTH_OF_ARRAY(testParams); i++)
			graphicsTests->addChild(newTestCase<PipelineFromCacheTest>(testCtx, &testParams[i]));

		cacheTests->addChild(graphicsTests.release());
	}

	// Graphics Pipeline Tests
	{
		de::MovePtr<tcu::TestCaseGroup> graphicsTests(new tcu::TestCaseGroup(testCtx, "pipeline_from_incomplete_get_data", "Test pipeline cache with graphics pipeline."));

		const VkShaderStageFlagBits testParamShaders0[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const VkShaderStageFlagBits testParamShaders1[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_GEOMETRY_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const VkShaderStageFlagBits testParamShaders2[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
			VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const CacheTestParam testParams[] =
		{
			CacheTestParam(testParamShaders0, DE_LENGTH_OF_ARRAY(testParamShaders0)),
			CacheTestParam(testParamShaders1, DE_LENGTH_OF_ARRAY(testParamShaders1)),
			CacheTestParam(testParamShaders2, DE_LENGTH_OF_ARRAY(testParamShaders2)),
		};

		for (deUint32 i = 0; i < DE_LENGTH_OF_ARRAY(testParams); i++)
			graphicsTests->addChild(newTestCase<PipelineFromIncompleteCacheTest>(testCtx, &testParams[i]));

		cacheTests->addChild(graphicsTests.release());
	}

	// Compute Pipeline Tests
	{
		de::MovePtr<tcu::TestCaseGroup> computeTests (new tcu::TestCaseGroup(testCtx, "compute_tests", "Test pipeline cache with compute pipeline."));

		const VkShaderStageFlagBits testParamShaders0[] =
		{
			VK_SHADER_STAGE_COMPUTE_BIT,
		};
		const CacheTestParam testParams[] =
		{
			CacheTestParam(testParamShaders0, DE_LENGTH_OF_ARRAY(testParamShaders0)),
		};

		for (deUint32 i = 0; i < DE_LENGTH_OF_ARRAY(testParams); i++)
			computeTests->addChild(newTestCase<ComputeCacheTest>(testCtx, &testParams[i]));

		cacheTests->addChild(computeTests.release());
	}

	// Misc Tests
	{
		de::MovePtr<tcu::TestCaseGroup> miscTests (new tcu::TestCaseGroup(testCtx, "misc_tests", "Misc tests that can not be categorized to other group."));

		const VkShaderStageFlagBits testParamShaders[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};

		const CacheTestParam testParam(testParamShaders, DE_LENGTH_OF_ARRAY(testParamShaders));
		miscTests->addChild(new MergeCacheTest(testCtx,
											   "merge_cache_test",
											   "Merge the caches test.",
											   &testParam));

		miscTests->addChild(new CacheHeaderTest(testCtx,
											   "cache_header_test",
											   "Cache header test.",
											   &testParam));

		miscTests->addChild(new InvalidSizeTest(testCtx,
												"invalid_size_test",
												"Invalid size test.",
												&testParam));

		cacheTests->addChild(miscTests.release());
	}

	return cacheTests.release();
}